

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O1

void gb_update_square_channel(SOUND *snd,UINT32 cycles)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (snd->on == true) {
    uVar3 = cycles + snd->cycles_left;
    snd->cycles_left = uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3 >> 2;
      snd->cycles_left = uVar3 & 3;
      uVar1 = snd->frequency_counter;
      uVar4 = 0x800 - uVar1 & 0xffff;
      uVar3 = uVar2 - uVar4;
      if (uVar4 <= uVar2) {
        uVar1 = (ushort)*(int *)&snd->frequency;
        uVar4 = 0x800U - *(int *)&snd->frequency & 0xffff;
        uVar2 = uVar3 % uVar4;
        uVar3 = uVar3 / uVar4 + snd->duty_count + 1 & 7;
        snd->duty_count = uVar3;
        snd->signal = (INT8)wave_duty_table[snd->duty][uVar3];
      }
      snd->frequency_counter = uVar1 + (short)uVar2;
    }
  }
  return;
}

Assistant:

static void gb_update_square_channel(struct SOUND *snd, UINT32 cycles)
{
	if (snd->on)
	{
		UINT16 distance;
		// compensate for leftover cycles
		snd->cycles_left += cycles;
		if (snd->cycles_left <= 0)
			return;

		cycles = snd->cycles_left >> 2;
		snd->cycles_left &= 3;
		distance = 0x800 - snd->frequency_counter;
		if (cycles >= distance)
		{
			UINT32 counter;
			cycles -= distance;
			distance = 0x800 - snd->frequency;
			counter = 1 + cycles / distance;

			snd->duty_count = (snd->duty_count + counter) & 0x07;
			snd->signal = wave_duty_table[snd->duty][snd->duty_count];

			snd->frequency_counter = snd->frequency + cycles % distance;
		}
		else
		{
			snd->frequency_counter += cycles;
		}
	}
}